

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O0

SpatialForceVector * __thiscall
iDynTree::Position::changePointOf(Position *this,SpatialForceVector *other)

{
  VectorFixSize<3U> *pVVar1;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other_00;
  double *dataPtr;
  Stride<0,_0> *this_01;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *other_01;
  long in_RDX;
  VectorFixSize<3U> *in_RSI;
  SpatialForceVector *in_RDI;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> resAngular;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> resLinear;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> otherAngular;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> otherLinear;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> thisPos;
  SpatialForceVector *result;
  SpatialForceVector *in_stack_fffffffffffffed0;
  PointerArgType in_stack_fffffffffffffed8;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>
  *in_stack_fffffffffffffee0;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff70;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_ffffffffffffff78;
  
  SpatialForceVector::SpatialForceVector(in_stack_fffffffffffffed0);
  VectorFixSize<3U>::data(in_RSI);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffed0);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (Stride<0,_0> *)in_stack_fffffffffffffed0);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                      ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8))->super_Vector3;
  this_00 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffed0);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (Stride<0,_0> *)in_stack_fffffffffffffed0);
  other_00 = (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                          ((SpatialVector<iDynTree::SpatialForceVector> *)(in_RDX + 8));
  VectorFixSize<3U>::data((VectorFixSize<3U> *)other_00);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffed0);
  Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             (Stride<0,_0> *)in_stack_fffffffffffffed0);
  pVVar1 = &SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3
                      (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>)->super_Vector3;
  dataPtr = VectorFixSize<3U>::data(pVVar1);
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)in_stack_fffffffffffffed0);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)pVVar1,dataPtr,
             (Stride<0,_0> *)in_stack_fffffffffffffed0);
  this_01 = (Stride<0,_0> *)
            SpatialVector<iDynTree::SpatialForceVector>::getAngularVec3
                      (&in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>);
  other_01 = (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)VectorFixSize<3U>::data((VectorFixSize<3U> *)this_01);
  Eigen::Stride<0,_0>::Stride(this_01);
  Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)pVVar1,dataPtr,
             this_01);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,other_01)
  ;
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+(this_00,other_00);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_01,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)other_01);
  return in_RDI;
}

Assistant:

SpatialForceVector Position::changePointOf(const SpatialForceVector & other) const
    {
        SpatialForceVector result;

        Eigen::Map<const Eigen::Vector3d> thisPos(this->data());
        Eigen::Map<const Eigen::Vector3d> otherLinear(other.getLinearVec3().data());
        Eigen::Map<const Eigen::Vector3d> otherAngular(other.getAngularVec3().data());
        Eigen::Map<Eigen::Vector3d> resLinear(result.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> resAngular(result.getAngularVec3().data());

        resLinear  = otherLinear;
        resAngular = thisPos.cross(otherLinear) + otherAngular;

        return result;
    }